

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

bool slang::ast::Expression::bindMembershipExpressions
               (ASTContext *context,TokenKind keyword,bool requireIntegral,bool unwrapUnpacked,
               bool allowTypeReferences,bool allowValueRange,ExpressionSyntax *valueExpr,
               span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL>
               expressions,SmallVectorBase<const_slang::ast::Expression_*> *results)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  string_view arg;
  string_view arg_00;
  SourceRange opRange;
  bitmask<slang::ast::ASTFlags> extraFlags_00;
  bitmask<slang::ast::ASTFlags> extraFlags_01;
  SmallVectorBase<const_slang::ast::Expression_*> *this;
  byte bVar1;
  bool bVar2;
  bool bVar3;
  ASTContext *ctx;
  SourceLocation SVar4;
  reference ppEVar5;
  ValueRangeExpression *this_00;
  iterator ppEVar6;
  reference ppEVar7;
  byte bVar8;
  undefined4 in_ECX;
  byte bVar9;
  undefined4 in_EDX;
  byte bVar10;
  undefined4 in_ESI;
  undefined2 uVar11;
  Diagnostic *in_RDI;
  undefined4 in_R8D;
  byte in_R9B;
  string_view sVar12;
  SmallVectorBase<const_slang::ast::Expression_*> *in_stack_00000020;
  Expression *expr_1;
  Expression *result;
  iterator __end2_1;
  iterator __begin2_1;
  SmallVectorBase<const_slang::ast::Expression_*> *__range2_1;
  size_t index;
  Type *bt;
  ValueRangeExpression *range;
  Expression *bound;
  ExpressionSyntax *expr;
  iterator __end2;
  iterator __begin2;
  span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL> *__range2;
  anon_class_72_9_cf3fa5c1 checkType;
  bool canBeStrings;
  bool bad;
  optional<unsigned_int> valueWidth;
  Type *type;
  Expression *valueRes;
  Compilation *comp;
  ASTFlags extraFlags;
  string_view keywordStr;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  undefined6 in_stack_fffffffffffffe10;
  TokenKind in_stack_fffffffffffffe16;
  Type *in_stack_fffffffffffffe18;
  Expression *pEVar13;
  ASTContext *in_stack_fffffffffffffe28;
  SourceLocation in_stack_fffffffffffffe30;
  SourceLocation in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  DiagCode DVar15;
  SourceLocation SVar14;
  Type *in_stack_fffffffffffffe48;
  Diagnostic *in_stack_fffffffffffffe50;
  SourceLocation SVar16;
  Diagnostic *pDVar17;
  TokenKind in_stack_fffffffffffffe8e;
  Expression *in_stack_fffffffffffffe90;
  ASTContext *in_stack_fffffffffffffe98;
  iterator local_150;
  size_type local_140;
  bitmask<slang::ast::ASTFlags> local_100;
  Expression *local_f8;
  Type *local_f0;
  ExpressionSyntax **local_e8;
  __normal_iterator<const_slang::syntax::ExpressionSyntax_*const_*,_std::span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL>_>
  local_e0;
  SourceLocation local_d8;
  Type **local_d0;
  SourceLocation local_c8;
  byte *local_c0;
  undefined1 *local_b0;
  byte *local_a8;
  Expression *local_a0;
  undefined1 *local_98;
  _Optional_payload_base<unsigned_int> *local_90;
  size_t local_88;
  char *local_80;
  SourceLocation local_78;
  SourceLocation local_70;
  undefined4 local_66;
  byte local_62;
  byte local_61;
  _Optional_payload_base<unsigned_int> local_60;
  Type *local_58;
  Expression *local_50;
  bitmask<slang::ast::ASTFlags> local_48;
  Expression *local_40;
  SourceLocation assignmentTarget;
  undefined2 in_stack_ffffffffffffffe8;
  bool local_1;
  
  DVar15 = SUB84((ulong)in_stack_fffffffffffffe40 >> 0x20,0);
  SVar16 = (SourceLocation)&stack0x00000010;
  uVar11 = (undefined2)in_ESI;
  bVar10 = (byte)in_EDX & 1;
  bVar9 = (byte)in_ECX & 1;
  bVar8 = (byte)in_R8D & 1;
  bVar1 = in_R9B & 1;
  sVar12 = parsing::LexerFacts::getTokenKindText(in_stack_fffffffffffffe16);
  ctx = (ASTContext *)0x0;
  if ((bVar8 & 1) != 0) {
    ctx = (ASTContext *)0x8000;
  }
  SVar4 = (SourceLocation)ASTContext::getCompilation((ASTContext *)0xa36251);
  pDVar17 = in_RDI;
  SVar14 = SVar4;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_48,(ASTFlags)ctx);
  extraFlags_00.m_bits._2_1_ = bVar1;
  extraFlags_00.m_bits._0_2_ = in_stack_ffffffffffffffe8;
  extraFlags_00.m_bits._3_1_ = bVar8;
  extraFlags_00.m_bits._4_1_ = bVar9;
  extraFlags_00.m_bits._5_1_ = bVar10;
  extraFlags_00.m_bits._6_2_ = uVar11;
  local_50 = create((Compilation *)sVar12._M_str,(ExpressionSyntax *)sVar12._M_len,ctx,extraFlags_00
                    ,(Type *)SVar14);
  local_40 = local_50;
  SmallVectorBase<const_slang::ast::Expression_*>::push_back
            ((SmallVectorBase<const_slang::ast::Expression_*> *)
             CONCAT26(in_stack_fffffffffffffe16,in_stack_fffffffffffffe10),
             (Expression **)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  local_58 = not_null::operator_cast_to_Type_((not_null<const_slang::ast::Type_*> *)0xa362f4);
  local_60 = (_Optional_payload_base<unsigned_int>)
             evalEffectiveWidth(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                                in_stack_fffffffffffffe8e);
  local_61 = Expression::bad((Expression *)
                             CONCAT26(in_stack_fffffffffffffe16,in_stack_fffffffffffffe10));
  local_62 = isImplicitString((Expression *)in_stack_fffffffffffffe98);
  if (((((bVar10 & 1) == 0) &&
       (bVar2 = Type::isAggregate((Type *)CONCAT44(in_stack_fffffffffffffe0c,
                                                   in_stack_fffffffffffffe08)), bVar2)) ||
      ((local_c8 = SVar14, (bVar10 & 1) != 0 &&
       (bVar2 = Type::isIntegral((Type *)CONCAT26(in_stack_fffffffffffffe16,
                                                  in_stack_fffffffffffffe10)), local_c8 = SVar14,
       !bVar2)))) && (local_c8 = SVar14, (local_61 & 1) == 0)) {
    local_66 = 0x270007;
    local_78 = (local_40->sourceRange).startLoc;
    local_70 = (local_40->sourceRange).endLoc;
    sourceRange.endLoc = in_stack_fffffffffffffe38;
    sourceRange.startLoc = in_stack_fffffffffffffe30;
    ASTContext::addDiag(in_stack_fffffffffffffe28,DVar15,sourceRange);
    ast::operator<<((Diagnostic *)CONCAT44(in_ESI,in_EDX),(Type *)CONCAT44(in_ECX,in_R8D));
    local_88 = sVar12._M_len;
    local_80 = sVar12._M_str;
    arg._M_len._4_4_ = in_ECX;
    arg._M_len._0_4_ = in_R8D;
    arg._M_str._0_4_ = in_EDX;
    arg._M_str._4_4_ = in_ESI;
    Diagnostic::operator<<(in_stack_fffffffffffffe50,arg);
    local_61 = 1;
    local_c8 = SVar14;
  }
  local_d0 = &local_58;
  local_c0 = &local_62;
  local_b0 = &stack0xffffffffffffffd8;
  local_a8 = &local_61;
  local_a0 = local_40;
  local_98 = &stack0xffffffffffffffee;
  local_90 = &local_60;
  local_d8 = SVar16;
  SVar14 = local_c8;
  local_e0._M_current =
       (ExpressionSyntax **)
       std::span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL> *)
                  CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  local_e8 = (ExpressionSyntax **)
             std::span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL>::end
                       ((span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL>
                         *)in_stack_fffffffffffffe18);
  while (bVar2 = __gnu_cxx::
                 operator==<const_slang::syntax::ExpressionSyntax_*const_*,_std::span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL>_>
                           ((__normal_iterator<const_slang::syntax::ExpressionSyntax_*const_*,_std::span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL>_>
                             *)CONCAT26(in_stack_fffffffffffffe16,in_stack_fffffffffffffe10),
                            (__normal_iterator<const_slang::syntax::ExpressionSyntax_*const_*,_std::span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL>_>
                             *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)),
        this = in_stack_00000020, ((bVar2 ^ 0xffU) & 1) != 0) {
    ppEVar5 = __gnu_cxx::
              __normal_iterator<const_slang::syntax::ExpressionSyntax_*const_*,_std::span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL>_>
              ::operator*(&local_e0);
    in_stack_fffffffffffffe48 = (Type *)*ppEVar5;
    in_stack_fffffffffffffe50 = in_RDI;
    local_f0 = in_stack_fffffffffffffe48;
    assignmentTarget = SVar14;
    bitmask<slang::ast::ASTFlags>::bitmask(&local_100,(ASTFlags)ctx);
    DVar15 = SVar14._4_4_;
    extraFlags_01.m_bits._2_1_ = bVar1;
    extraFlags_01.m_bits._0_2_ = in_stack_ffffffffffffffe8;
    extraFlags_01.m_bits._3_1_ = bVar8;
    extraFlags_01.m_bits._4_1_ = bVar9;
    extraFlags_01.m_bits._5_1_ = bVar10;
    extraFlags_01.m_bits._6_2_ = uVar11;
    local_f8 = create((Compilation *)sVar12._M_str,(ExpressionSyntax *)sVar12._M_len,ctx,
                      extraFlags_01,(Type *)assignmentTarget);
    SmallVectorBase<const_slang::ast::Expression_*>::push_back
              ((SmallVectorBase<const_slang::ast::Expression_*> *)
               CONCAT26(in_stack_fffffffffffffe16,in_stack_fffffffffffffe10),
               (Expression **)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    bVar3 = Expression::bad((Expression *)
                            CONCAT26(in_stack_fffffffffffffe16,in_stack_fffffffffffffe10));
    bVar2 = (local_61 & 1) != 0;
    local_61 = bVar2 || bVar3;
    if (!bVar2 && !bVar3) {
      if (((bVar1 & 1) == 0) || (local_f8->kind != ValueRange)) {
        not_null::operator_cast_to_Type_((not_null<const_slang::ast::Type_*> *)0xa366ee);
        if ((bVar10 & 1) == 0) {
          if ((bVar9 & 1) != 0) {
            while (bVar2 = Type::isUnpackedArray
                                     ((Type *)CONCAT44(in_stack_fffffffffffffe0c,
                                                       in_stack_fffffffffffffe08)), bVar2) {
              Type::getArrayElementType(in_stack_fffffffffffffe18);
            }
          }
          if ((((local_62 & 1) != 0) &&
              (bVar2 = isImplicitString((Expression *)in_stack_fffffffffffffe98), !bVar2)) &&
             (bVar2 = Type::isString((Type *)0xa3683e), !bVar2)) {
            local_62 = 0;
          }
          bindMembershipExpressions::anon_class_72_9_cf3fa5c1::operator()
                    ((anon_class_72_9_cf3fa5c1 *)sVar12._M_len,(Expression *)ctx,
                     (Type *)assignmentTarget);
        }
        else {
          bVar2 = Type::isIntegral((Type *)CONCAT26(in_stack_fffffffffffffe16,
                                                    in_stack_fffffffffffffe10));
          if (bVar2) {
            bindMembershipExpressions::anon_class_72_9_cf3fa5c1::operator()
                      ((anon_class_72_9_cf3fa5c1 *)sVar12._M_len,(Expression *)ctx,
                       (Type *)assignmentTarget);
          }
          else {
            sourceRange_00.endLoc = in_stack_fffffffffffffe38;
            sourceRange_00.startLoc = in_stack_fffffffffffffe30;
            ASTContext::addDiag(in_stack_fffffffffffffe28,DVar15,sourceRange_00);
            ast::operator<<((Diagnostic *)CONCAT44(in_ESI,in_EDX),(Type *)CONCAT44(in_ECX,in_R8D));
            arg_00._M_len._4_4_ = in_ECX;
            arg_00._M_len._0_4_ = in_R8D;
            arg_00._M_str._0_4_ = in_EDX;
            arg_00._M_str._4_4_ = in_ESI;
            Diagnostic::operator<<(in_stack_fffffffffffffe50,arg_00);
            local_61 = 1;
          }
        }
      }
      else {
        if (((local_62 & 1) != 0) &&
           (bVar2 = isImplicitString((Expression *)in_stack_fffffffffffffe98), !bVar2)) {
          local_62 = 0;
        }
        this_00 = as<slang::ast::ValueRangeExpression>(local_f8);
        in_stack_fffffffffffffe38 = (SourceLocation)ValueRangeExpression::left(this_00);
        ValueRangeExpression::left(this_00);
        not_null<const_slang::ast::Type_*>::operator*
                  ((not_null<const_slang::ast::Type_*> *)0xa36675);
        bindMembershipExpressions::anon_class_72_9_cf3fa5c1::operator()
                  ((anon_class_72_9_cf3fa5c1 *)sVar12._M_len,(Expression *)ctx,
                   (Type *)assignmentTarget);
        if (this_00->rangeKind == Simple) {
          in_stack_fffffffffffffe30 = (SourceLocation)ValueRangeExpression::right(this_00);
          ValueRangeExpression::right(this_00);
          not_null<const_slang::ast::Type_*>::operator*
                    ((not_null<const_slang::ast::Type_*> *)0xa366c3);
          bindMembershipExpressions::anon_class_72_9_cf3fa5c1::operator()
                    ((anon_class_72_9_cf3fa5c1 *)sVar12._M_len,(Expression *)ctx,
                     (Type *)assignmentTarget);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_slang::syntax::ExpressionSyntax_*const_*,_std::span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL>_>
    ::operator++(&local_e0);
    SVar14 = assignmentTarget;
  }
  if ((local_61 & 1) == 0) {
    local_140 = 0;
    local_150 = SmallVectorBase<const_slang::ast::Expression_*>::begin(in_stack_00000020);
    ppEVar6 = SmallVectorBase<const_slang::ast::Expression_*>::end(this);
    for (; local_150 != ppEVar6; local_150 = local_150 + 1) {
      pEVar13 = *local_150;
      bVar2 = Type::isNumeric((Type *)CONCAT26(in_stack_fffffffffffffe16,in_stack_fffffffffffffe10))
      ;
      if ((bVar2) || (bVar2 = Type::isString((Type *)0xa3692d), bVar2)) {
        not_null<const_slang::ast::Type_*>::operator->
                  ((not_null<const_slang::ast::Type_*> *)0xa36944);
        bVar2 = Type::isUnpackedArray
                          ((Type *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        if (bVar2) goto LAB_00a369ab;
        SourceRange::SourceRange
                  ((SourceRange *)CONCAT26(in_stack_fffffffffffffe16,in_stack_fffffffffffffe10));
        in_stack_fffffffffffffe08 = 1;
        opRange.endLoc = SVar4;
        opRange.startLoc = SVar16;
        contextDetermined((ASTContext *)CONCAT44(in_ESI,in_EDX),
                          (Expression **)CONCAT44(in_ECX,in_R8D),
                          (Expression *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,opRange,
                          (ConversionKind)pDVar17);
      }
      else {
LAB_00a369ab:
        selfDetermined((ASTContext *)CONCAT44(in_ESI,in_EDX),(Expression **)CONCAT44(in_ECX,in_R8D))
        ;
      }
      ppEVar7 = SmallVectorBase<const_slang::ast::Expression_*>::operator[]
                          (in_stack_00000020,local_140);
      *ppEVar7 = pEVar13;
      local_140 = local_140 + 1;
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Expression::bindMembershipExpressions(const ASTContext& context, TokenKind keyword,
                                           bool requireIntegral, bool unwrapUnpacked,
                                           bool allowTypeReferences, bool allowValueRange,
                                           const ExpressionSyntax& valueExpr,
                                           std::span<const ExpressionSyntax* const> expressions,
                                           SmallVectorBase<const Expression*>& results) {
    const auto keywordStr = LexerFacts::getTokenKindText(keyword);
    auto extraFlags = allowTypeReferences ? ASTFlags::AllowTypeReferences : ASTFlags::None;
    Compilation& comp = context.getCompilation();
    Expression& valueRes = create(comp, valueExpr, context, extraFlags);
    results.push_back(&valueRes);

    const Type* type = valueRes.type;
    auto valueWidth = evalEffectiveWidth(context, valueRes, keyword);
    bool bad = valueRes.bad();
    bool canBeStrings = valueRes.isImplicitString();

    if ((!requireIntegral && type->isAggregate()) || (requireIntegral && !type->isIntegral())) {
        if (!bad) {
            context.addDiag(diag::BadSetMembershipType, valueRes.sourceRange)
                << *type << keywordStr;
            bad = true;
        }
    }

    auto checkType = [&](const Expression& expr, const Type& bt) {
        if (bt.isNumeric() && type->isNumeric()) {
            type = OpInfo::binaryType(comp, type, &bt, false);
        }
        else if ((bt.isClass() && bt.isAssignmentCompatible(*type)) ||
                 (type->isClass() && type->isAssignmentCompatible(bt))) {
            // ok
        }
        else if ((bt.isCHandle() || bt.isNull()) && (type->isCHandle() || type->isNull())) {
            // ok
        }
        else if ((bt.isEvent() || bt.isNull()) && (type->isEvent() || type->isNull())) {
            // ok
        }
        else if ((bt.isCovergroup() || bt.isNull()) && (type->isCovergroup() || type->isNull())) {
            // ok
        }
        else if (bt.isTypeRefType() && type->isTypeRefType()) {
            // ok
        }
        else if (bt.isUnbounded() && (type->isNumeric() || type->isString())) {
            // ok
        }
        else if (canBeStrings) {
            // If canBeStrings is still true, it means either this specific type or
            // the common type (or both) are of type string. This is ok, but force
            // all further expressions to also be strings (or implicitly
            // convertible to them).
            type = &comp.getStringType();
        }
        else if (bt.isAggregate()) {
            // Aggregates are just never allowed in membership expressions.
            context.addDiag(diag::BadSetMembershipType, expr.sourceRange) << bt << keywordStr;
            bad = true;
        }
        else {
            // Couldn't find a common type.
            context.addDiag(diag::NoCommonComparisonType, expr.sourceRange)
                << keywordStr << bt << *type;
            bad = true;
        }

        if (!bad && !bt.isMatching(*valueRes.type) && !bt.isUnbounded()) {
            auto& lct = bt.getCanonicalType();
            auto& rct = valueRes.type->getCanonicalType();
            BinaryExpression::analyzeOpTypes(lct, rct, bt, *valueRes.type, expr, valueRes, context,
                                             expr.sourceRange, diag::CaseTypeMismatch,
                                             /* isComparison */ false, keywordStr);

            if (expr.type->isIntegral() && valueRes.type->isIntegral()) {
                // Check whether either the item or the value expression is
                // a constant integral (but not both). If so, check that the
                // constant value's effective width is not larger than the
                // bit width of the other expression, which would make it
                // impossible to ever match.
                auto exprWidth = evalEffectiveWidth(context, expr, keyword);
                auto vw = valueWidth.value_or(valueRes.type->getBitWidth());

                if (valueWidth > expr.type->getBitWidth() && !exprWidth) {
                    auto& diag = context.addDiag(diag::CaseOutsideRange, expr.sourceRange);
                    diag << keywordStr << expr.type->getBitWidth() << *valueWidth;
                }
                else if (exprWidth > vw && !valueWidth) {
                    auto& diag = context.addDiag(diag::CaseOutsideRange, expr.sourceRange);
                    diag << keywordStr << *exprWidth << vw;
                }
            }
        }
    };

    // We need to find a common type across all expressions. If this is for a wildcard
    // case statement, the types can only be integral. Otherwise all singular types are allowed.
    for (auto expr : expressions) {
        Expression* bound = &create(comp, *expr, context, extraFlags);
        results.push_back(bound);
        bad |= bound->bad();
        if (bad)
            continue;

        // Special handling for value range expressions -- they don't have
        // a real type on their own, we need to check their bounds.
        if (allowValueRange && bound->kind == ExpressionKind::ValueRange) {
            if (canBeStrings && !bound->isImplicitString())
                canBeStrings = false;

            auto& range = bound->as<ValueRangeExpression>();
            checkType(range.left(), *range.left().type);
            if (range.rangeKind == ValueRangeKind::Simple)
                checkType(range.right(), *range.right().type);
            continue;
        }

        const Type* bt = bound->type;
        if (requireIntegral) {
            if (!bt->isIntegral()) {
                context.addDiag(diag::BadSetMembershipType, bound->sourceRange)
                    << *bt << keywordStr;
                bad = true;
            }
            else {
                checkType(*bound, *bt);
            }
            continue;
        }

        // If this is an "inside" operation, then unpacked arrays are unwrapped
        // into their element types before checking further.
        if (unwrapUnpacked) {
            while (bt->isUnpackedArray())
                bt = bt->getArrayElementType();
        }

        if (canBeStrings && !bound->isImplicitString() && !bt->isString())
            canBeStrings = false;

        checkType(*bound, *bt);
    }

    if (bad)
        return false;

    size_t index = 0;
    for (auto result : results) {
        // const_casts here are because we want the result array to be constant and
        // don't want to waste time / space allocating another array here locally just
        // to immediately copy it to the output.
        Expression* expr = const_cast<Expression*>(result);

        if ((type->isNumeric() || type->isString()) && !expr->type->isUnpackedArray())
            contextDetermined(context, expr, nullptr, *type, {});
        else
            selfDetermined(context, expr);

        SLANG_ASSERT(!expr->bad());
        results[index++] = expr;
    }

    return true;
}